

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

bool __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::setText
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,char *start,char *end)

{
  bool bVar1;
  byte *pbVar2;
  string<char> s;
  undefined1 local_30 [32];
  
  if ((long)end - (long)start < 3) {
    pbVar2 = (byte *)start;
    if (start != end) {
      do {
        if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0))
        goto LAB_00694922;
        pbVar2 = pbVar2 + 1;
      } while (pbVar2 != (byte *)end);
    }
    bVar1 = false;
  }
  else {
LAB_00694922:
    core::string<char>::string<char>
              ((string<char> *)(local_30 + 0x10),start,(s32)((long)end - (long)start));
    replaceSpecialCharacters
              ((CXMLReaderImpl<char,_irr::io::IXMLBase> *)local_30,(string<char> *)this);
    core::string<char>::operator=(&this->NodeName,(string<char> *)local_30);
    if ((_func_int **)local_30._0_8_ != (_func_int **)0x0) {
      operator_delete__((void *)local_30._0_8_);
    }
    this->CurrentNodeType = EXN_TEXT;
    if ((char *)local_30._16_8_ != (char *)0x0) {
      operator_delete__((void *)local_30._16_8_);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool setText(char_type* start, char_type* end)
	{
		// check if text is more than 2 characters, and if not, check if there is 
		// only white space, so that this text won't be reported
		if (end - start < 3)
		{
			char_type* p = start;
			for(; p != end; ++p)
				if (!isWhiteSpace(*p))
					break;

			if (p == end)
				return false;
		}

		// set current text to the parsed text, and replace xml special characters
		core::string<char_type> s(start, (int)(end - start));
		NodeName = replaceSpecialCharacters(s);

		// current XML node type is text
		CurrentNodeType = EXN_TEXT;

		return true;
	}